

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall
CVmObjBigNum::getp_copy_sign(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  ushort uVar1;
  int iVar2;
  char *ext2;
  char *new_ext;
  vm_val_t val2;
  
  uVar1 = *(ushort *)(this->super_CVmObject).ext_;
  iVar2 = setup_getp_1(this,self,retval,argc,&new_ext,&val2,&ext2,1);
  if (iVar2 == 0) {
    memcpy(new_ext,(this->super_CVmObject).ext_,(ulong)(uVar1 + 1 >> 1) + 5);
    new_ext[4] = new_ext[4] & 0xfeU | ext2[4] & 1U;
    normalize(new_ext);
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_copy_sign(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *argc)
{
    vm_val_t val2;
    char *new_ext;
    const char *ext2;
    size_t prec = get_prec(ext_);

    if (setup_getp_1(vmg_ self, retval, argc, &new_ext,
                     &val2, &ext2, TRUE))
        return TRUE;

    /* make a copy of my value in the new object */
    memcpy(new_ext, ext_, calc_alloc(prec));

    /* set the sign from the other object */
    set_neg(new_ext, get_neg(ext2));

    /* 
     *   normalize it (this is important when the value was zero to start
     *   with, since zero is always represented without a negative sign) 
     */
    normalize(new_ext);

    /* remove the GC protection */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}